

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

void __thiscall Fl_Table::col_width(Fl_Table *this,int col,int width)

{
  uint uVar1;
  Fl_When FVar2;
  int *piVar3;
  Fl_Callback_p pFVar4;
  uint local_1c;
  int now_size;
  int width_local;
  int col_local;
  Fl_Table *this_local;
  
  if ((-1 < col) &&
     ((uVar1 = IntVector::size(&this->_colwidths), (int)uVar1 <= col ||
      (piVar3 = IntVector::operator[](&this->_colwidths,col), *piVar3 != width)))) {
    local_1c = IntVector::size(&this->_colwidths);
    if ((int)local_1c <= col) {
      IntVector::size(&this->_colwidths,col + 1);
      while ((int)local_1c < col) {
        piVar3 = IntVector::operator[](&this->_colwidths,local_1c);
        *piVar3 = width;
        local_1c = local_1c + 1;
      }
    }
    piVar3 = IntVector::operator[](&this->_colwidths,col);
    *piVar3 = width;
    table_resized(this);
    if (col <= this->rightcol) {
      Fl_Widget::redraw((Fl_Widget *)this);
    }
    pFVar4 = Fl_Widget::callback((Fl_Widget *)this);
    if ((pFVar4 != (Fl_Callback_p)0x0) &&
       (FVar2 = Fl_Widget::when((Fl_Widget *)this), (FVar2 & FL_WHEN_CHANGED) != FL_WHEN_NEVER)) {
      do_callback(this,CONTEXT_RC_RESIZE,0,col);
    }
  }
  return;
}

Assistant:

void Fl_Table::col_width(int col, int width)
{
  if ( col < 0 ) return;
  if ( col < (int)_colwidths.size() && _colwidths[col] == width ) {
    return;			// OPTIMIZATION: no change? avoid redraw
  }
  // Add column widths, even if none yet
  int now_size = (int)_colwidths.size();
  if ( col >= now_size ) {
    _colwidths.size(col+1);
    while (now_size < col) {
      _colwidths[now_size++] = width;
    }
  }
  _colwidths[col] = width;
  table_resized();
  if ( col <= rightcol ) {	// OPTIMIZATION: only redraw if onscreen or to the left
    redraw();
  }
  // COLUMN RESIZE CALLBACK
  if ( Fl_Widget::callback() && when() & FL_WHEN_CHANGED ) {
    do_callback(CONTEXT_RC_RESIZE, 0, col);
  }
}